

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

void compactIndex2(UNewTrie2 *trie)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  bool bVar4;
  int local_24;
  int32_t overlap;
  int32_t movedStart;
  int32_t newStart;
  int32_t start;
  int32_t i;
  UNewTrie2 *trie_local;
  
  newStart = 0;
  for (movedStart = 0; movedStart < 0x820; movedStart = movedStart + 0x40) {
    trie->map[newStart] = movedStart;
    newStart = newStart + 1;
  }
  overlap = (trie->highStart + -0x10000 >> 0xb) + 0x840;
  movedStart = 0xa60;
  while (movedStart < trie->index2Length) {
    iVar2 = findSameIndex2Block(trie->index2,overlap,movedStart);
    iVar3 = movedStart >> 6;
    if (iVar2 < 0) {
      local_24 = 0x3f;
      while( true ) {
        bVar4 = false;
        if (0 < local_24) {
          UVar1 = equal_int32(trie->index2 + (overlap - local_24),trie->index2 + movedStart,local_24
                             );
          bVar4 = UVar1 == '\0';
        }
        if (!bVar4) break;
        local_24 = local_24 + -1;
      }
      if ((local_24 < 1) && (movedStart <= overlap)) {
        trie->map[iVar3] = movedStart;
        overlap = movedStart + 0x40;
        movedStart = overlap;
      }
      else {
        trie->map[iVar3] = overlap - local_24;
        movedStart = local_24 + movedStart;
        for (newStart = 0x40 - local_24; 0 < newStart; newStart = newStart + -1) {
          trie->index2[overlap] = trie->index2[movedStart];
          overlap = overlap + 1;
          movedStart = movedStart + 1;
        }
      }
    }
    else {
      trie->map[iVar3] = iVar2;
      movedStart = movedStart + 0x40;
    }
  }
  for (newStart = 0; newStart < 0x220; newStart = newStart + 1) {
    trie->index1[newStart] = trie->map[trie->index1[newStart] >> 6];
  }
  trie->index2NullOffset = trie->map[trie->index2NullOffset >> 6];
  while ((overlap & 3U) != 0) {
    trie->index2[overlap] = 0x3fffc;
    overlap = overlap + 1;
  }
  trie->index2Length = overlap;
  return;
}

Assistant:

static void
compactIndex2(UNewTrie2 *trie) {
    int32_t i, start, newStart, movedStart, overlap;

    /* do not compact linear-BMP index-2 blocks */
    newStart=UTRIE2_INDEX_2_BMP_LENGTH;
    for(start=0, i=0; start<newStart; start+=UTRIE2_INDEX_2_BLOCK_LENGTH, ++i) {
        trie->map[i]=start;
    }

    /* Reduce the index table gap to what will be needed at runtime. */
    newStart+=UTRIE2_UTF8_2B_INDEX_2_LENGTH+((trie->highStart-0x10000)>>UTRIE2_SHIFT_1);

    for(start=UNEWTRIE2_INDEX_2_NULL_OFFSET; start<trie->index2Length;) {
        /*
         * start: index of first entry of current block
         * newStart: index where the current block is to be moved
         *           (right after current end of already-compacted data)
         */

        /* search for an identical block */
        if( (movedStart=findSameIndex2Block(trie->index2, newStart, start))
             >=0
        ) {
            /* found an identical block, set the other block's index value for the current block */
            trie->map[start>>UTRIE2_SHIFT_1_2]=movedStart;

            /* advance start to the next block */
            start+=UTRIE2_INDEX_2_BLOCK_LENGTH;

            /* leave newStart with the previous block! */
            continue;
        }

        /* see if the beginning of this block can be overlapped with the end of the previous block */
        /* look for maximum overlap with the previous, adjacent block */
        for(overlap=UTRIE2_INDEX_2_BLOCK_LENGTH-1;
            overlap>0 && !equal_int32(trie->index2+(newStart-overlap), trie->index2+start, overlap);
            --overlap) {}

        if(overlap>0 || newStart<start) {
            /* some overlap, or just move the whole block */
            trie->map[start>>UTRIE2_SHIFT_1_2]=newStart-overlap;

            /* move the non-overlapping indexes to their new positions */
            start+=overlap;
            for(i=UTRIE2_INDEX_2_BLOCK_LENGTH-overlap; i>0; --i) {
                trie->index2[newStart++]=trie->index2[start++];
            }
        } else /* no overlap && newStart==start */ {
            trie->map[start>>UTRIE2_SHIFT_1_2]=start;
            start+=UTRIE2_INDEX_2_BLOCK_LENGTH;
            newStart=start;
        }
    }

    /* now adjust the index-1 table */
    for(i=0; i<UNEWTRIE2_INDEX_1_LENGTH; ++i) {
        trie->index1[i]=trie->map[trie->index1[i]>>UTRIE2_SHIFT_1_2];
    }
    trie->index2NullOffset=trie->map[trie->index2NullOffset>>UTRIE2_SHIFT_1_2];

    /*
     * Ensure data table alignment:
     * Needs to be granularity-aligned for 16-bit trie
     * (so that dataMove will be down-shiftable),
     * and 2-aligned for uint32_t data.
     */
    while((newStart&((UTRIE2_DATA_GRANULARITY-1)|1))!=0) {
        /* Arbitrary value: 0x3fffc not possible for real data. */
        trie->index2[newStart++]=(int32_t)0xffff<<UTRIE2_INDEX_SHIFT;
    }

#ifdef UTRIE2_DEBUG
    /* we saved some space */
    printf("compacting UTrie2: count of 16-bit index words %lu->%lu\n",
            (long)trie->index2Length, (long)newStart);
#endif

    trie->index2Length=newStart;
}